

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void __thiscall diy::AMRLink::load(AMRLink *this,BinaryBuffer *bb)

{
  Link *in_RSI;
  Description *in_RDI;
  
  Link::load(in_RSI,(BinaryBuffer *)in_RDI);
  load<int>((BinaryBuffer *)in_RSI,&in_RDI->level);
  load<diy::AMRLink::Description>((BinaryBuffer *)in_RSI,in_RDI);
  load<std::vector<diy::AMRLink::Description,std::allocator<diy::AMRLink::Description>>>
            ((BinaryBuffer *)in_RSI,
             (vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_> *)in_RDI
            );
  load<std::vector<diy::Direction,std::allocator<diy::Direction>>>
            ((BinaryBuffer *)in_RSI,
             (vector<diy::Direction,_std::allocator<diy::Direction>_> *)in_RDI);
  return;
}

Assistant:

void          load(BinaryBuffer& bb) override
      {
          Link::load(bb);
          diy::load(bb, dim_);
          diy::load(bb, local_);
          diy::load(bb, nbr_descriptions_);
          diy::load(bb, wrap_);
      }